

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O2

void __thiscall slang::ast::NetSymbol::serializeTo(NetSymbol *this,ASTSerializer *serializer)

{
  TimingControl *__n;
  optional<slang::ast::ChargeStrength> oVar1;
  string_view sVar2;
  pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_> pVar3;
  
  ASTSerializer::write(serializer,7,"netType",(size_t)this->netType);
  if (this->isImplicit == true) {
    ASTSerializer::write(serializer,10,"isImplicit",1);
  }
  if ((this->expansionHint == Vectored) || (this->expansionHint == Scalared)) {
    ASTSerializer::write(serializer,0xd,"expansionHint",8);
  }
  __n = getDelay(this);
  if (__n != (TimingControl *)0x0) {
    ASTSerializer::write(serializer,5,"delay",(size_t)__n);
  }
  oVar1 = getChargeStrength(this);
  if (((ulong)oVar1.super__Optional_base<slang::ast::ChargeStrength,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::ChargeStrength> >> 0x20 & 1) != 0) {
    sVar2 = ast::toString(oVar1.super__Optional_base<slang::ast::ChargeStrength,_true,_true>.
                          _M_payload.super__Optional_payload_base<slang::ast::ChargeStrength>.
                          _M_payload);
    ASTSerializer::write(serializer,0xe,"chargeStrength",sVar2._M_len);
  }
  pVar3 = getDriveStrength(this);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
    sVar2 = ast::toString(pVar3.first.super__Optional_base<slang::ast::DriveStrength,_true,_true>.
                          _M_payload.super__Optional_payload_base<slang::ast::DriveStrength>.
                          _M_payload);
    ASTSerializer::write(serializer,0xe,"driveStrength0",sVar2._M_len);
  }
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
    sVar2 = ast::toString(pVar3.second.super__Optional_base<slang::ast::DriveStrength,_true,_true>.
                          _M_payload.super__Optional_payload_base<slang::ast::DriveStrength>.
                          _M_payload);
    ASTSerializer::write(serializer,0xe,"driveStrength1",sVar2._M_len);
    return;
  }
  return;
}

Assistant:

void NetSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("netType", netType);

    if (isImplicit)
        serializer.write("isImplicit", isImplicit);

    switch (expansionHint) {
        case Vectored:
            serializer.write("expansionHint", "vectored"sv);
            break;
        case Scalared:
            serializer.write("expansionHint", "scalared"sv);
            break;
        default:
            break;
    }

    if (auto delayCtrl = getDelay())
        serializer.write("delay", *delayCtrl);

    if (auto chargeStrength = getChargeStrength())
        serializer.write("chargeStrength", toString(*chargeStrength));

    auto [ds0, ds1] = getDriveStrength();
    if (ds0)
        serializer.write("driveStrength0", toString(*ds0));
    if (ds1)
        serializer.write("driveStrength1", toString(*ds1));
}